

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

qreal __thiscall QTextEdit::tabStopDistance(QTextEdit *this)

{
  long in_FS_OFFSET;
  QTextOption local_28 [8];
  qreal local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetTextControl::document
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              0x2f8));
  QTextDocument::defaultTextOption();
  QTextOption::~QTextOption(local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

qreal QTextEdit::tabStopDistance() const
{
    Q_D(const QTextEdit);
    return d->control->document()->defaultTextOption().tabStopDistance();
}